

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

int __thiscall
flow::CastInstr::clone(CastInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Value *local_30;
  LiteralType local_24;
  unique_ptr<flow::CastInstr,_std::default_delete<flow::CastInstr>_> local_20 [2];
  CastInstr *this_local;
  
  local_20[1]._M_t.super___uniq_ptr_impl<flow::CastInstr,_std::default_delete<flow::CastInstr>_>.
  _M_t.super__Tuple_impl<0UL,_flow::CastInstr_*,_std::default_delete<flow::CastInstr>_>.
  super__Head_base<0UL,_flow::CastInstr_*,_false>._M_head_impl =
       (__uniq_ptr_data<flow::CastInstr,_std::default_delete<flow::CastInstr>,_true,_true>)
       (__uniq_ptr_data<flow::CastInstr,_std::default_delete<flow::CastInstr>,_true,_true>)__fn;
  this_local = this;
  local_24 = Value::type((Value *)__fn);
  local_30 = source((CastInstr *)__fn);
  Value::name_abi_cxx11_((Value *)__fn);
  std::make_unique<flow::CastInstr,flow::LiteralType,flow::Value*,std::__cxx11::string_const&>
            ((LiteralType *)local_20,(Value **)&local_24,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::CastInstr,std::default_delete<flow::CastInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)this,local_20);
  std::unique_ptr<flow::CastInstr,_std::default_delete<flow::CastInstr>_>::~unique_ptr(local_20);
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> CastInstr::clone() {
  return std::make_unique<CastInstr>(type(), source(), name());
}